

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O3

bool tcu::isGatherOffsetsResultValid<tcu::IntLookupPrecision,int>
               (ConstPixelBufferAccess *level,Sampler *sampler,IntLookupPrecision *prec,Vec2 *coord,
               int coordZ,int componentNdx,IVec2 (*offsets) [4],Vector<int,_4> *result)

{
  ulong uVar1;
  int size;
  int iVar2;
  int y;
  int z;
  ulong uVar3;
  int offNdx;
  long lVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  uint uVar9;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  undefined1 auVar10 [16];
  Vector<bool,_4> res;
  Vector<int,_4> color;
  Vec2 vBounds;
  Vec2 uBounds;
  int local_98;
  ConstPixelBufferAccess local_88;
  IntLookupPrecision *local_60;
  undefined1 local_58 [16];
  TexVerifierUtil local_40 [8];
  float local_38;
  float local_34;
  
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&local_38,sampler->normalizedCoords,(level->m_size).m_data[0],
             coord->m_data[0],(prec->coordBits).m_data[0],(prec->uvwBits).m_data[0]);
  local_60 = prec;
  TexVerifierUtil::computeNonNormalizedCoordBounds
            (local_40,sampler->normalizedCoords,(level->m_size).m_data[1],coord->m_data[1],
             (prec->coordBits).m_data[1],(prec->uvwBits).m_data[1]);
  fVar5 = floorf(local_38 + -0.5);
  fVar6 = floorf(local_34 + -0.5);
  local_88.m_size.m_data[2] = (int)(local_40._0_4_ + -0.5);
  local_88.m_pitch.m_data[0] = (int)(local_40._4_4_ + -0.5);
  local_88.m_pitch.m_data[1] = 0;
  local_88.m_pitch.m_data[2] = 0;
  fVar7 = floorf((float)local_88.m_size.m_data[2]);
  fVar8 = floorf((float)local_88.m_pitch.m_data[0]);
  local_98 = (int)fVar7;
  if (local_98 <= (int)fVar8) {
    local_88.m_size.m_data[2] = (level->m_size).m_data[0];
    size = (level->m_size).m_data[1];
    iVar2 = (int)fVar5;
    do {
      for (; iVar2 <= (int)fVar6; iVar2 = iVar2 + 1) {
        local_58 = (undefined1  [16])0x0;
        lVar4 = 0;
        do {
          y = TexVerifierUtil::wrap
                        (sampler->wrapS,(*offsets)[lVar4].m_data[0] + iVar2,
                         local_88.m_size.m_data[2]);
          z = TexVerifierUtil::wrap(sampler->wrapT,(*offsets)[lVar4].m_data[1] + local_98,size);
          if ((((y < 0) || ((level->m_size).m_data[0] <= y)) || (z < 0)) ||
             ((((level->m_size).m_data[1] <= z || (coordZ < 0)) ||
              ((level->m_size).m_data[2] <= coordZ)))) {
            sampleTextureBorder<int>(&local_88.m_format,(Sampler *)level);
          }
          else {
            ConstPixelBufferAccess::getPixelT<int>(&local_88,(int)level,y,z);
          }
          *(int *)(local_58 + lVar4 * 4) = local_88.m_size.m_data[(long)componentNdx + -2];
          lVar4 = lVar4 + 1;
        } while (lVar4 != 4);
        uVar9 = -(uint)(result->m_data[0] < (int)local_58._0_4_);
        uVar11 = -(uint)(result->m_data[1] < (int)local_58._4_4_);
        uVar12 = -(uint)(result->m_data[2] < (int)local_58._8_4_);
        uVar13 = -(uint)(result->m_data[3] < (int)local_58._12_4_);
        auVar10._0_4_ =
             -(uint)((int)((local_60->colorThreshold).m_data[0] ^ 0x80000000) <
                    (int)(uVar9 - (local_58._0_4_ - result->m_data[0] ^ uVar9) ^ 0x80000000));
        auVar10._4_4_ =
             -(uint)((int)((local_60->colorThreshold).m_data[1] ^ 0x80000000) <
                    (int)(uVar11 - (local_58._4_4_ - result->m_data[1] ^ uVar11) ^ 0x80000000));
        auVar10._8_4_ =
             -(uint)((int)((local_60->colorThreshold).m_data[2] ^ 0x80000000) <
                    (int)(uVar12 - (local_58._8_4_ - result->m_data[2] ^ uVar12) ^ 0x80000000));
        auVar10._12_4_ =
             -(uint)((int)((local_60->colorThreshold).m_data[3] ^ 0x80000000) <
                    (int)(uVar13 - (local_58._12_4_ - result->m_data[3] ^ uVar13) ^ 0x80000000));
        auVar10 = packssdw(auVar10,auVar10);
        auVar10 = packsswb(auVar10 ^ _DAT_00ae2300,auVar10 ^ _DAT_00ae2300);
        auVar10 = ZEXT416(*(uint *)(local_60->colorMask).m_data) ^ _DAT_00ac4030 |
                  auVar10 & _DAT_00ac4030;
        local_88.m_format.order = auVar10._0_4_;
        if (auVar10[0] != '\0') {
          uVar3 = 0xffffffffffffffff;
          do {
            if (uVar3 == 2) {
              return true;
            }
            uVar1 = uVar3 + 1;
            lVar4 = uVar3 - 6;
            uVar3 = uVar1;
          } while (*(char *)((long)local_88.m_size.m_data + lVar4) != '\0');
          if (2 < uVar1) {
            return true;
          }
        }
      }
      local_98 = local_98 + 1;
      iVar2 = (int)fVar5;
    } while (local_98 <= (int)fVar8);
  }
  return false;
}

Assistant:

static bool isGatherOffsetsResultValid (const ConstPixelBufferAccess&	level,
										const Sampler&					sampler,
										const PrecType&					prec,
										const Vec2&						coord,
										int								coordZ,
										int								componentNdx,
										const IVec2						(&offsets)[4],
										const Vector<ScalarType, 4>&	result)
{
	const Vec2	uBounds		= computeNonNormalizedCoordBounds(sampler.normalizedCoords, level.getWidth(), coord.x(), prec.coordBits.x(), prec.uvwBits.x());
	const Vec2	vBounds		= computeNonNormalizedCoordBounds(sampler.normalizedCoords, level.getHeight(), coord.y(), prec.coordBits.y(), prec.uvwBits.y());

	// Integer coordinate bounds for (x0, y0) - without wrap mode
	const int	minI		= deFloorFloatToInt32(uBounds.x()-0.5f);
	const int	maxI		= deFloorFloatToInt32(uBounds.y()-0.5f);
	const int	minJ		= deFloorFloatToInt32(vBounds.x()-0.5f);
	const int	maxJ		= deFloorFloatToInt32(vBounds.y()-0.5f);

	const int	w			= level.getWidth();
	const int	h			= level.getHeight();

	for (int j = minJ; j <= maxJ; j++)
	{
		for (int i = minI; i <= maxI; i++)
		{
			Vector<ScalarType, 4> color;
			for (int offNdx = 0; offNdx < 4; offNdx++)
			{
				// offNdx-th coordinate offset and then wrapped.
				const int x = wrap(sampler.wrapS, i+offsets[offNdx].x(), w);
				const int y = wrap(sampler.wrapT, j+offsets[offNdx].y(), h);
				color[offNdx] = lookup<ScalarType>(level, sampler, x, y, coordZ)[componentNdx];
			}

			if (isColorValid(prec, color, result))
				return true;
		}
	}

	return false;
}